

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3__on_seek_memory(void *pUserData,int byteOffset,ma_dr_mp3_seek_origin origin)

{
  ma_dr_mp3 *pMP3;
  ma_dr_mp3_seek_origin origin_local;
  int byteOffset_local;
  void *pUserData_local;
  
  if (origin == ma_dr_mp3_seek_origin_current) {
    byteOffset_local = byteOffset;
    if (byteOffset < 1) {
      if (*(ulong *)((long)pUserData + 0x3eb8) < (ulong)(long)-byteOffset) {
        byteOffset_local = -(int)*(undefined8 *)((long)pUserData + 0x3eb8);
      }
    }
    else if (*(ulong *)((long)pUserData + 0x3eb0) <
             (ulong)(*(long *)((long)pUserData + 0x3eb8) + (long)byteOffset)) {
      byteOffset_local =
           (int)*(undefined8 *)((long)pUserData + 0x3eb0) -
           (int)*(undefined8 *)((long)pUserData + 0x3eb8);
    }
    *(long *)((long)pUserData + 0x3eb8) =
         (long)byteOffset_local + *(long *)((long)pUserData + 0x3eb8);
  }
  else if (*(ulong *)((long)pUserData + 0x3eb0) < (ulong)(uint)byteOffset) {
    *(undefined8 *)((long)pUserData + 0x3eb8) = *(undefined8 *)((long)pUserData + 0x3eb0);
  }
  else {
    *(long *)((long)pUserData + 0x3eb8) = (long)byteOffset;
  }
  return 1;
}

Assistant:

static ma_bool32 ma_dr_mp3__on_seek_memory(void* pUserData, int byteOffset, ma_dr_mp3_seek_origin origin)
{
    ma_dr_mp3* pMP3 = (ma_dr_mp3*)pUserData;
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    if (origin == ma_dr_mp3_seek_origin_current) {
        if (byteOffset > 0) {
            if (pMP3->memory.currentReadPos + byteOffset > pMP3->memory.dataSize) {
                byteOffset = (int)(pMP3->memory.dataSize - pMP3->memory.currentReadPos);
            }
        } else {
            if (pMP3->memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(int)pMP3->memory.currentReadPos;
            }
        }
        pMP3->memory.currentReadPos += byteOffset;
    } else {
        if ((ma_uint32)byteOffset <= pMP3->memory.dataSize) {
            pMP3->memory.currentReadPos = byteOffset;
        } else {
            pMP3->memory.currentReadPos = pMP3->memory.dataSize;
        }
    }
    return MA_TRUE;
}